

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.c
# Opt level: O3

int main(int argc,char **argv)

{
  void *__buf;
  bool bVar1;
  int iVar2;
  light_pcapng_stream pcapng;
  light_pcapng p_Var3;
  void *__ptr;
  char *__s;
  char *pcVar4;
  uint32_t *__buf_00;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  char **ppcVar12;
  ulong uVar13;
  char trace_path [4096];
  uint local_108c;
  uint32_t *local_1088;
  size_t local_1080;
  int local_1078;
  int local_1074;
  light_pcapng_stream local_1070;
  ulong local_1068;
  int local_105c;
  char **local_1058;
  char *local_1050;
  ulong local_1048;
  char *local_1040;
  char local_1038 [4104];
  
  uVar13 = (ulong)(uint)argc;
  local_108c = 0;
  local_1058 = argv;
  while( true ) {
    do {
      while (iVar2 = getopt(argc,argv,"n:t:b:f:c"), 0x65 < iVar2) {
        if ((iVar2 != 0x66) && (iVar2 != 0x74)) {
          if (iVar2 != 0x6e) goto LAB_0010293a;
          local_108c = atoi(_optarg);
          printf("Set packet limit to %d\n",(ulong)local_108c);
        }
      }
    } while (iVar2 == 0x62);
    if (iVar2 != 99) break;
    pcVar10 = argv[_optind];
    if (pcVar10 != (char *)0x0) {
      ppcVar12 = argv + _optind;
      do {
        iVar2 = access(pcVar10,4);
        if (iVar2 == 0) {
          pcapng = light_open_stream(*ppcVar12);
          if (pcapng == (light_pcapng_stream)0x0) {
            main_cold_1();
            uVar11 = 0;
          }
          else {
            uVar11 = 0;
            do {
              uVar11 = (ulong)((int)uVar11 + 1);
              p_Var3 = light_read_stream(pcapng);
            } while (p_Var3 != (light_pcapng)0x0);
          }
          light_close_stream(pcapng);
          printf("--> %s has %u blocks\n",*ppcVar12,uVar11);
        }
        pcVar10 = ppcVar12[1];
        ppcVar12 = ppcVar12 + 1;
        argv = local_1058;
      } while (pcVar10 != (char *)0x0);
    }
  }
  if (iVar2 == -1) {
    if (1 < argc && local_108c != 0) {
      uVar11 = 1;
      local_1068 = uVar13;
      do {
        iVar2 = access(argv[uVar11],4);
        if (iVar2 == 0) {
          pcVar10 = argv[uVar11];
          __ptr = calloc(1,8);
          memset(local_1038,0,0x1000);
          __s = strdup(pcVar10);
          pcVar4 = strrchr(__s,0x2e);
          *pcVar4 = '\0';
          local_1040 = pcVar10;
          local_1070 = light_open_stream(pcVar10);
          if (local_1070 == (light_pcapng_stream)0x0) {
            free(__ptr);
            free(__s);
            uVar13 = local_1068;
          }
          else {
            sprintf(local_1038,"%s_%04d.pcapng",__s,0);
            iVar2 = open(local_1038,0x42,0x1b6);
            if (iVar2 == -1) {
              fprintf(_stderr,"Unable to open file for write: %s\n",local_1038);
              free(__ptr);
              free(__s);
              light_close_stream(local_1070);
              uVar13 = local_1068;
            }
            else {
              local_1080 = 0;
              local_1050 = __s;
              local_1048 = uVar11;
              p_Var3 = light_read_stream(local_1070);
              __buf_00 = light_pcapng_to_memory(p_Var3,&local_1080);
              local_105c = iVar2;
              if (__buf_00 == (uint32_t *)0x0) {
                uVar8 = 0;
                local_1088 = (uint32_t *)0x0;
              }
              else {
                local_1088 = (uint32_t *)0x0;
                local_1078 = 1;
                uVar13 = 0;
                local_1074 = 0;
                uVar9 = 0;
                do {
                  iVar7 = (int)uVar13;
                  if (*__buf_00 == 1) {
                    if (iVar7 == local_1078) {
                      local_1078 = local_1078 * 2;
                      __ptr = realloc(__ptr,(long)local_1078);
                    }
                    *(uint32_t **)((long)__ptr + (long)iVar7 * 8) = __buf_00;
                    uVar13 = (ulong)(iVar7 + 1);
                    bVar1 = false;
                  }
                  else if (*__buf_00 == 0xa0d0d0a) {
                    if (local_1088 != (uint32_t *)0x0) {
                      if (0 < iVar7) {
                        uVar11 = 0;
                        do {
                          free(*(void **)((long)__ptr + uVar11 * 8));
                          *(undefined8 *)((long)__ptr + uVar11 * 8) = 0;
                          uVar11 = uVar11 + 1;
                        } while (uVar13 != uVar11);
                      }
                      free(local_1088);
                      uVar13 = 0;
                    }
                    __buf_00[4] = 0xffffffff;
                    __buf_00[5] = 0xffffffff;
                    bVar1 = false;
                    local_1088 = __buf_00;
                  }
                  else {
                    uVar9 = uVar9 + 1;
                    bVar1 = true;
                  }
                  uVar8 = (uint)uVar13;
                  sVar5 = write(iVar2,__buf_00,local_1080);
                  if (sVar5 != local_1080) {
                    fprintf(_stderr,
                            "Warning: write error occurred for %s: failed to write %zu bytes\n.",
                            local_1038);
                  }
                  if (bVar1) {
                    free(__buf_00);
                  }
                  if (uVar9 == local_108c) {
                    close(iVar2);
                    local_1074 = local_1074 + 1;
                    sprintf(local_1038,"%s_%04d.pcapng",local_1050);
                    iVar2 = open(local_1038,0x42,0x1b6);
                    uVar11 = write(iVar2,local_1088,(ulong)local_1088[1]);
                    if (uVar11 != local_1088[1]) {
                      fprintf(_stderr,
                              "Warning: write error occurred for %s: failed to write %u bytes\n.",
                              local_1038);
                    }
                    uVar9 = 0;
                    if (0 < (int)uVar8) {
                      uVar11 = 0;
                      do {
                        __buf = *(void **)((long)__ptr + uVar11 * 8);
                        uVar6 = write(iVar2,__buf,(ulong)*(uint *)((long)__buf + 4));
                        if (uVar6 != *(uint *)(*(long *)((long)__ptr + uVar11 * 8) + 4)) {
                          fprintf(_stderr,
                                  "Warning: write error occurred for %s: failed to write %u bytes\n."
                                  ,local_1038);
                        }
                        uVar11 = uVar11 + 1;
                      } while (uVar13 != uVar11);
                    }
                  }
                  local_1080 = 0;
                  p_Var3 = light_read_stream(local_1070);
                  __buf_00 = light_pcapng_to_memory(p_Var3,&local_1080);
                } while (__buf_00 != (uint32_t *)0x0);
              }
              printf("Split %s into %d files.\n",local_1040,(ulong)((iVar2 - local_105c) + 1));
              free(local_1050);
              close(iVar2);
              if (0 < (int)uVar8) {
                uVar13 = 0;
                do {
                  free(*(void **)((long)__ptr + uVar13 * 8));
                  uVar13 = uVar13 + 1;
                } while (uVar8 != uVar13);
              }
              free(__ptr);
              free(local_1088);
              light_close_stream(local_1070);
              argv = local_1058;
              uVar11 = local_1048;
              uVar13 = local_1068;
            }
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar13);
    }
    return 0;
  }
LAB_0010293a:
  exit(1);
}

Assistant:

int main(int argc, char * const argv[]) {
	// TODO: split trace in N intervals.
	// TODO: split trace in N bytes size.
	// ...
	// TODO: split trace using histogram function.
	int option = 0;
	int n = 0;

	while ((option = getopt(argc, argv, "n:t:b:f:c")) != -1) {
		switch (option) {
		case 'n':
			n = atoi(optarg);
			printf("Set packet limit to %d\n", n);
			break;
		case 't':
			break;
		case 'b':
			break;
		case 'f':
			break;
		case 'c':
			test_split_count(argc - optind, &argv[optind]);
			break;
		default:
			exit(EXIT_FAILURE);
		}
	}

	if (n != 0) {
		int i;
		for (i = 1; i < argc; ++i) {
			if (access(argv[i], F_OK | R_OK) == 0) {
				test_split_trace(n, argv[i]);
			}
		}
	}

	return 0;
}